

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QString * __thiscall
QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]> *this)

{
  long lVar1;
  QChar *pQVar2;
  long in_FS_OFFSET;
  iterator d;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (((this->a).a)->d).size + 1 + (((this->a).b)->d).size;
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1,Uninitialized);
  pQVar2 = (QChar *)(__return_storage_ptr__->d).ptr;
  local_38 = pQVar2;
  QConcatenable<QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]>_>::
  appendTo<QChar>(this,&local_38);
  if (lVar1 != (long)local_38 - (long)pQVar2 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }